

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O0

int __thiscall
jrtplib::RTPUDPv4Transmitter::JoinMulticastGroup(RTPUDPv4Transmitter *this,RTPAddress *addr)

{
  AddressType AVar1;
  int iVar2;
  uint32_t local_4c;
  uint32_t local_48;
  ip_mreq mreq_2;
  ip_mreq mreq_1;
  ip_mreq mreq;
  uint32_t mcastIP;
  RTPIPv4Address *address;
  int status;
  RTPAddress *addr_local;
  RTPUDPv4Transmitter *this_local;
  
  if ((this->init & 1U) == 0) {
    this_local._4_4_ = -0x5a;
  }
  else if ((this->created & 1U) == 0) {
    this_local._4_4_ = -0x59;
  }
  else {
    AVar1 = RTPAddress::GetAddressType(addr);
    if (AVar1 == IPv4Address) {
      unique0x100001d2 = addr;
      mreq.imr_multiaddr.s_addr = RTPIPv4Address::GetIP((RTPIPv4Address *)addr);
      if ((mreq.imr_multiaddr.s_addr & 0xf0000000) == 0xe0000000) {
        address._4_4_ =
             RTPHashTable<const_unsigned_int,_jrtplib::RTPUDPv4Trans_GetHashIndex_uint32_t,_8317>::
             AddElement(&this->multicastgroups,(uint *)&mreq);
        if (-1 < address._4_4_) {
          mreq_1.imr_multiaddr.s_addr = htonl(mreq.imr_multiaddr.s_addr);
          mreq_1.imr_interface.s_addr = htonl(this->mcastifaceIP);
          iVar2 = setsockopt(this->rtpsock,0,0x23,&mreq_1,8);
          if (iVar2 != 0) {
            RTPHashTable<const_unsigned_int,_jrtplib::RTPUDPv4Trans_GetHashIndex_uint32_t,_8317>::
            DeleteElement(&this->multicastgroups,(uint *)&mreq);
            return -0x51;
          }
          if (this->rtpsock != this->rtcpsock) {
            mreq_2.imr_multiaddr.s_addr = htonl(mreq.imr_multiaddr.s_addr);
            mreq_2.imr_interface.s_addr = htonl(this->mcastifaceIP);
            iVar2 = setsockopt(this->rtcpsock,0,0x23,&mreq_2,8);
            if (iVar2 != 0) {
              local_4c = htonl(mreq.imr_multiaddr.s_addr);
              local_48 = htonl(this->mcastifaceIP);
              setsockopt(this->rtpsock,0,0x24,&local_4c,8);
              RTPHashTable<const_unsigned_int,_jrtplib::RTPUDPv4Trans_GetHashIndex_uint32_t,_8317>::
              DeleteElement(&this->multicastgroups,(uint *)&mreq);
              return -0x51;
            }
          }
          address._4_4_ = 0;
        }
        this_local._4_4_ = address._4_4_;
      }
      else {
        this_local._4_4_ = -0x58;
      }
    }
    else {
      this_local._4_4_ = -0x54;
    }
  }
  return this_local._4_4_;
}

Assistant:

int RTPUDPv4Transmitter::JoinMulticastGroup(const RTPAddress &addr)
{
	if (!init)
		return ERR_RTP_UDPV4TRANS_NOTINIT;

	MAINMUTEX_LOCK
	
	int status;
	
	if (!created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV4TRANS_NOTCREATED;
	}
	if (addr.GetAddressType() != RTPAddress::IPv4Address)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV4TRANS_INVALIDADDRESSTYPE;
	}
	
	const RTPIPv4Address &address = (const RTPIPv4Address &)addr;
	uint32_t mcastIP = address.GetIP();
	
	if (!RTPUDPV4TRANS_IS_MCASTADDR(mcastIP))
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV4TRANS_NOTAMULTICASTADDRESS;
	}
	
	status = multicastgroups.AddElement(mcastIP);
	if (status >= 0)
	{
		RTPUDPV4TRANS_MCASTMEMBERSHIP(rtpsock,IP_ADD_MEMBERSHIP,mcastIP,status);
		if (status != 0)
		{
			multicastgroups.DeleteElement(mcastIP);
			MAINMUTEX_UNLOCK
			return ERR_RTP_UDPV4TRANS_COULDNTJOINMULTICASTGROUP;
		}

		if (rtpsock != rtcpsock) // no need to join multicast group twice when multiplexing
		{
			RTPUDPV4TRANS_MCASTMEMBERSHIP(rtcpsock,IP_ADD_MEMBERSHIP,mcastIP,status);
			if (status != 0)
			{
				RTPUDPV4TRANS_MCASTMEMBERSHIP(rtpsock,IP_DROP_MEMBERSHIP,mcastIP,status);
				multicastgroups.DeleteElement(mcastIP);
				MAINMUTEX_UNLOCK
				return ERR_RTP_UDPV4TRANS_COULDNTJOINMULTICASTGROUP;
			}
		}
	}
	MAINMUTEX_UNLOCK	
	return status;
}